

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

NULLCRef * NULLCTypeInfo::GetInstanceByName(NULLCRef *__return_storage_ptr__,NULLCArray name)

{
  TypeID typeID;
  char *pcVar1;
  NULLCArray name_00;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  name_00.len = (uint)name.ptr;
  name_00.ptr = name.ptr;
  typeID = GetType(name_00);
  if (typeID.typeID != 0) {
    pcVar1 = (char *)nullcAllocateTyped(typeID.typeID);
    __return_storage_ptr__->ptr = pcVar1;
    __return_storage_ptr__->typeID = typeID.typeID;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef GetInstanceByName(NULLCArray name)
	{
		NULLCRef r = { 0, 0 };

		TypeID typeID = GetType(name);
		if(!typeID.typeID)
			return r;

		r.ptr = (char*)nullcAllocateTyped(typeID.typeID);
		r.typeID = typeID.typeID;
		return r;
	}